

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall dg::vr::StructureAnalyzer::findLoops(StructureAnalyzer *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  pointer ppVar4;
  pointer this_00;
  VRInstruction *this_01;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>,_bool>
  pVar5;
  VRInstruction *op;
  VREdge *edge;
  size_t i;
  VRLocation *source;
  LazyDFS it_1;
  vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *loop;
  set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
  backwardReach;
  VRLocation *location;
  LazyDFS it;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  VRLocation *in_stack_fffffffffffffd58;
  VRLocation *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  byte in_stack_fffffffffffffd6f;
  map<const_dg::vr::VRLocation_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>,_std::less<const_dg::vr::VRLocation_*>,_std::allocator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>_>
  *in_stack_fffffffffffffd70;
  VRLocation *in_stack_fffffffffffffd78;
  _Self local_258;
  _Self local_250;
  VREdge *local_248;
  VRLocation *in_stack_fffffffffffffdc0;
  _Self local_238;
  VRLocation *local_230;
  _Self local_228;
  VRLocation *local_220;
  VRLocation *in_stack_fffffffffffffe78;
  Function *in_stack_fffffffffffffe80;
  StructureAnalyzer *in_stack_fffffffffffffe88;
  VRLocation local_158;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  undefined8 local_10;
  
  local_10 = *in_RDI;
  local_18.NodePtr = (node_pointer)llvm::Module::begin((Module *)in_stack_fffffffffffffd58);
  local_158.join = (VRLocation *)llvm::Module::end((Module *)in_stack_fffffffffffffd58);
  while (bVar1 = llvm::operator!=(&local_18,
                                  (ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                                   *)&local_158.join), bVar1) {
    local_158.loopEnds.
    super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                               *)0x1ee50c);
    uVar3 = llvm::GlobalValue::isDeclaration();
    if ((uVar3 & 1) == 0) {
      VRCodeGraph::lazy_dfs_begin
                ((VRCodeGraph *)in_stack_fffffffffffffd78,(Function *)in_stack_fffffffffffffd70);
      while( true ) {
        VRCodeGraph::lazy_dfs_end();
        bVar1 = vr::operator!=((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60,
                               (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd58);
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
                  ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60);
        if (!bVar1) break;
        local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator*
                       ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)0x1ee5af);
        bVar1 = VRLocation::isJustLoopJoin(in_stack_fffffffffffffd78);
        if (bVar1) {
          collectBackward(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                          in_stack_fffffffffffffe78);
          in_stack_fffffffffffffd70 =
               (map<const_dg::vr::VRLocation_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>,_std::less<const_dg::vr::VRLocation_*>,_std::allocator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>_>
                *)(in_RDI + 2);
          local_158.relations.graph.buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
          local_158.id = 0;
          local_158._4_4_ = 0;
          local_158.relations.graph.reported = (ValueRelations *)0x0;
          local_158.relations.graph.buckets._M_t._M_impl._0_8_ = 0;
          in_stack_fffffffffffffd78 = &local_158;
          std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::vector
                    ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                      *)0x1ee636);
          pVar5 = std::
                  map<dg::vr::VRLocation_const*,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>,std::less<dg::vr::VRLocation_const*>,std::allocator<std::pair<dg::vr::VRLocation_const*const,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>>>
                  ::
                  emplace<dg::vr::VRLocation*,std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>>
                            (in_stack_fffffffffffffd70,
                             (VRLocation **)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                             (vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                              *)in_stack_fffffffffffffd60);
          local_158.relations.graph.buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)pVar5.first._M_node;
          local_158.relations.graph.buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
          _0_1_ = pVar5.second;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>
                                 *)0x1ee687);
          std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>::
          ~vector((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *)
                  in_stack_fffffffffffffd70);
          local_158.relations.graph.buckets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)&ppVar4->second;
          VRCodeGraph::lazy_dfs_begin
                    ((VRCodeGraph *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     (Function *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          while( true ) {
            VRCodeGraph::lazy_dfs_end();
            in_stack_fffffffffffffd6f =
                 vr::operator!=((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60,
                                (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd58);
            VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
                      ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60);
            if ((in_stack_fffffffffffffd6f & 1) == 0) break;
            local_230 = VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator*
                                  ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)0x1ee735);
            local_220 = local_230;
            local_228._M_node =
                 (_Base_ptr)
                 std::
                 set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                 ::find((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                         *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                        (key_type *)in_stack_fffffffffffffd60);
            local_238._M_node =
                 (_Base_ptr)
                 std::
                 set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                 ::end((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                        *)in_stack_fffffffffffffd58);
            bVar1 = std::operator==(&local_228,&local_238);
            if (!bVar1) {
              in_stack_fffffffffffffd60 = (VRLocation *)0x0;
              while (in_stack_fffffffffffffdc0 = in_stack_fffffffffffffd60,
                    uVar2 = VRLocation::succsSize((VRLocation *)0x1ee7b3),
                    in_stack_fffffffffffffd60 < (VRLocation *)(ulong)uVar2) {
                local_248 = VRLocation::getSuccEdge
                                      (in_stack_fffffffffffffd60,
                                       (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20));
                if (local_248->target != (VRLocation *)0x0) {
                  local_250._M_node =
                       (_Base_ptr)
                       std::
                       set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                       ::find((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                               *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                              (key_type *)in_stack_fffffffffffffd60);
                  local_258._M_node =
                       (_Base_ptr)
                       std::
                       set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                       ::end((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                              *)in_stack_fffffffffffffd58);
                  bVar1 = std::operator!=(&local_250,&local_258);
                  if (bVar1) {
                    this_00 = std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::
                              operator->((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>
                                          *)0x1ee83f);
                    bVar1 = VROp::isInstruction(this_00);
                    if (bVar1) {
                      this_01 = (VRInstruction *)
                                std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::
                                get((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)
                                    0x1ee85b);
                      in_stack_fffffffffffffd58 =
                           (VRLocation *)
                           local_158.relations.graph.buckets._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
                      VRInstruction::getInstruction(this_01);
                      std::vector<llvm::Instruction_const*,std::allocator<llvm::Instruction_const*>>
                      ::emplace_back<llvm::Instruction_const*>
                                ((vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                                  *)in_stack_fffffffffffffd70,
                                 (Instruction **)
                                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
                    }
                  }
                  else {
                    std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
                    emplace_back<dg::vr::VREdge*&>
                              ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                *)in_stack_fffffffffffffd70,
                               (VREdge **)
                               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
                  }
                }
                in_stack_fffffffffffffd60 = (VRLocation *)((long)&in_stack_fffffffffffffdc0->id + 1)
                ;
              }
              if ((local_220 !=
                   (VRLocation *)
                   local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent) &&
                 ((local_220->join == (VRLocation *)0x0 ||
                  (*(VRLocation **)
                    ((long)local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_parent + 0x138) != (VRLocation *)0x0)))) {
                local_220->join =
                     (VRLocation *)
                     local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
              }
            }
            VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++
                      ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffdc0);
          }
          local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_
               = 7;
          VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
                    ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60);
          std::
          set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
          ::~set((set<dg::vr::VRLocation_*,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                  *)0x1ee927);
        }
        VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++
                  ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffdc0);
      }
      local_158.relations.valToBucket._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 4
      ;
      VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
                ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_fffffffffffffd60);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

void StructureAnalyzer::findLoops() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.lazy_dfs_begin(function);
             it != codeGraph.lazy_dfs_end(); ++it) {
            VRLocation &location = *it;

            if (!location.isJustLoopJoin())
                continue;

            auto backwardReach = collectBackward(function, location);

            auto &loop =
                    inloopValues
                            .emplace(&location,
                                     std::vector<const llvm::Instruction *>())
                            .first->second;

            for (auto it = codeGraph.lazy_dfs_begin(function, location);
                 it != codeGraph.lazy_dfs_end(); ++it) {
                VRLocation &source = *it;

                if (backwardReach.find(&source) == backwardReach.end())
                    continue;

                for (size_t i = 0; i < source.succsSize(); ++i) {
                    VREdge *edge = source.getSuccEdge(i);
                    if (!edge->target)
                        continue;

                    if (backwardReach.find(edge->target) !=
                        backwardReach.end()) {
                        if (edge->op->isInstruction()) {
                            auto *op = static_cast<VRInstruction *>(
                                    edge->op.get());
                            loop.emplace_back(op->getInstruction());
                        }
                    } else
                        location.loopEnds.emplace_back(edge);
                }

                if (&source != &location && (!source.join || location.join))
                    source.join = &location;
            }
        }
    }
}